

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O0

void Min_CubeCreate(Vec_Str_t *vCover,Min_Cube_t *pCube,char Type)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int local_20;
  int i;
  char Type_local;
  Min_Cube_t *pCube_local;
  Vec_Str_t *vCover_local;
  
  uVar1 = *(uint *)&pCube->field_0x8;
  uVar2 = Min_CubeCountLits(pCube);
  if (uVar1 >> 0x16 != uVar2) {
    __assert_fail("(int)pCube->nLits == Min_CubeCountLits(pCube)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMinUtil.c"
                  ,0x30,"void Min_CubeCreate(Vec_Str_t *, Min_Cube_t *, char)");
  }
  for (local_20 = 0; local_20 < (int)(*(uint *)&pCube->field_0x8 & 0x3ff); local_20 = local_20 + 1)
  {
    iVar3 = Min_CubeHasBit(pCube,local_20 << 1);
    if (iVar3 == 0) {
      iVar3 = Min_CubeHasBit(pCube,local_20 * 2 + 1);
      if (iVar3 == 0) {
        Vec_StrPush(vCover,'?');
      }
      else {
        Vec_StrPush(vCover,'1');
      }
    }
    else {
      iVar3 = Min_CubeHasBit(pCube,local_20 * 2 + 1);
      if (iVar3 == 0) {
        Vec_StrPush(vCover,'0');
      }
      else {
        Vec_StrPush(vCover,'-');
      }
    }
  }
  Vec_StrPush(vCover,' ');
  Vec_StrPush(vCover,Type);
  Vec_StrPush(vCover,'\n');
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Min_CubeCreate( Vec_Str_t * vCover, Min_Cube_t * pCube, char Type )
{
    int i;
    assert( (int)pCube->nLits == Min_CubeCountLits(pCube) );
    for ( i = 0; i < (int)pCube->nVars; i++ )
        if ( Min_CubeHasBit(pCube, i*2) )
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
//                fprintf( pFile, "-" );
                Vec_StrPush( vCover, '-' );
            else
//                fprintf( pFile, "0" );
                Vec_StrPush( vCover, '0' );
        }
        else
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
 //               fprintf( pFile, "1" );
                Vec_StrPush( vCover, '1' );
            else
//                fprintf( pFile, "?" );
                Vec_StrPush( vCover, '?' );
        }
//    fprintf( pFile, " 1\n" );
    Vec_StrPush( vCover, ' ' );
    Vec_StrPush( vCover, Type );
    Vec_StrPush( vCover, '\n' );
}